

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void getPixelColorRGBA16(unsigned_short *r,unsigned_short *g,unsigned_short *b,unsigned_short *a,
                        uchar *in,size_t i,LodePNGColorMode *mode)

{
  uchar uVar1;
  uchar uVar2;
  long lVar3;
  unsigned_short uVar4;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar4 = CONCAT11(in[i * 2],in[i * 2 + 1]);
    *b = uVar4;
    *g = uVar4;
    *r = uVar4;
    if ((mode->key_defined == 0) || ((uint)CONCAT11(in[i * 2],in[i * 2 + 1]) != mode->key_r))
    goto LAB_00114a1f;
LAB_0011496d:
    uVar4 = 0;
    break;
  default:
    goto switchD_0011491f_caseD_1;
  case LCT_RGB:
    lVar3 = i * 6;
    *r = CONCAT11(in[lVar3],in[lVar3 + 1]);
    *g = *(ushort *)(in + lVar3 + 2) << 8 | *(ushort *)(in + lVar3 + 2) >> 8;
    *b = *(ushort *)(in + lVar3 + 4) << 8 | *(ushort *)(in + lVar3 + 4) >> 8;
    if ((((mode->key_defined != 0) && ((uint)CONCAT11(in[lVar3],in[lVar3 + 1]) == mode->key_r)) &&
        ((uint)(ushort)(*(ushort *)(in + lVar3 + 2) << 8 | *(ushort *)(in + lVar3 + 2) >> 8) ==
         mode->key_g)) &&
       ((uint)(ushort)(*(ushort *)(in + lVar3 + 4) << 8 | *(ushort *)(in + lVar3 + 4) >> 8) ==
        mode->key_b)) goto LAB_0011496d;
LAB_00114a1f:
    uVar4 = 0xffff;
    break;
  case LCT_GREY_ALPHA:
    uVar4 = CONCAT11(in[i * 4],in[i * 4 + 1]);
    *b = uVar4;
    *g = uVar4;
    *r = uVar4;
    uVar1 = in[i * 4 + 2];
    uVar2 = in[i * 4 + 3];
    goto LAB_00114a71;
  case LCT_RGBA:
    *r = CONCAT11(in[i * 8],in[i * 8 + 1]);
    *g = CONCAT11(in[i * 8 + 2],in[i * 8 + 3]);
    *b = CONCAT11(in[i * 8 + 4],in[i * 8 + 5]);
    uVar1 = in[i * 8 + 6];
    uVar2 = in[i * 8 + 7];
LAB_00114a71:
    uVar4 = CONCAT11(uVar1,uVar2);
  }
  *a = uVar4;
switchD_0011491f_caseD_1:
  return;
}

Assistant:

static void getPixelColorRGBA16(unsigned short* r, unsigned short* g, unsigned short* b, unsigned short* a,
                                const unsigned char* in, size_t i, const LodePNGColorMode* mode)
{
  if(mode->colortype == LCT_GREY)
  {
    *r = *g = *b = 256 * in[i * 2 + 0] + in[i * 2 + 1];
    if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_RGB)
  {
    *r = 256u * in[i * 6 + 0] + in[i * 6 + 1];
    *g = 256u * in[i * 6 + 2] + in[i * 6 + 3];
    *b = 256u * in[i * 6 + 4] + in[i * 6 + 5];
    if(mode->key_defined
       && 256u * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
       && 256u * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
       && 256u * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    *r = *g = *b = 256u * in[i * 4 + 0] + in[i * 4 + 1];
    *a = 256u * in[i * 4 + 2] + in[i * 4 + 3];
  }
  else if(mode->colortype == LCT_RGBA)
  {
    *r = 256u * in[i * 8 + 0] + in[i * 8 + 1];
    *g = 256u * in[i * 8 + 2] + in[i * 8 + 3];
    *b = 256u * in[i * 8 + 4] + in[i * 8 + 5];
    *a = 256u * in[i * 8 + 6] + in[i * 8 + 7];
  }
}